

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_NextPrime(DdGen *gen,int **cube)

{
  int *piVar1;
  DdManager *dd;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int length;
  int local_34;
  
  dd = gen->manager;
  pDVar4 = gen->node;
  pDVar3 = Cudd_ReadLogicZero(dd);
  if (pDVar4 == pDVar3) {
    gen->status = 0;
LAB_0080b6f6:
    if (gen->status == 0) {
      return 0;
    }
    *cube = (gen->gen).cubes.cube;
    return 1;
  }
  pDVar4 = Cudd_LargestCube(dd,gen->node,&local_34);
  if (pDVar4 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = Cudd_bddMakePrime(dd,pDVar4,(gen->gen).primes.ub);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar5 = Cudd_bddAnd(dd,gen->node,(DdNode *)((ulong)pDVar3 ^ 1));
      pDVar4 = pDVar3;
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,gen->node);
        gen->node = pDVar5;
        iVar2 = Cudd_BddToCubeArray(dd,pDVar3,(gen->gen).cubes.cube);
        Cudd_RecursiveDeref(dd,pDVar3);
        if (iVar2 != 0) {
          gen->status = 1;
          goto LAB_0080b6f6;
        }
        goto LAB_0080b71d;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar4);
  }
LAB_0080b71d:
  gen->status = 0;
  return 0;
}

Assistant:

int
Cudd_NextPrime(
  DdGen *gen,
  int **cube)
{
    DdNode *implicant, *prime, *tmp;
    DdManager *dd = gen->manager;
    int length, result;

    if (gen->node == Cudd_ReadLogicZero(dd)) {
        gen->status = CUDD_GEN_EMPTY;
    } else {
        implicant = Cudd_LargestCube(dd,gen->node,&length);
        if (implicant == NULL) {
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,gen->gen.primes.ub);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,implicant);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,gen->node,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,prime);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,gen->node);
        gen->node = tmp;
        result = Cudd_BddToCubeArray(dd,prime,gen->gen.primes.cube);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,prime);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        Cudd_RecursiveDeref(dd,prime);
        gen->status = CUDD_GEN_NONEMPTY;
    }
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *cube = gen->gen.primes.cube;
    return(1);

}